

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dependency.cpp
# Opt level: O3

string * rtrim(string *s)

{
  pointer pcVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  pointer pcVar5;
  pointer pcVar6;
  pointer pcVar7;
  
  pcVar1 = (s->_M_dataplus)._M_p;
  uVar4 = s->_M_string_length;
  pcVar6 = pcVar1 + uVar4;
  lVar3 = (long)uVar4 >> 2;
  pcVar7 = pcVar6;
  if (0 < lVar3) {
    pcVar7 = pcVar6 + -(uVar4 & 0xfffffffffffffffc);
    pcVar6 = pcVar6 + lVar3 * -4;
    lVar3 = lVar3 + 1;
    do {
      iVar2 = isspace((uint)(byte)pcVar1[uVar4 - 1]);
      if (iVar2 == 0) {
        pcVar5 = pcVar1 + uVar4;
        goto LAB_00105daa;
      }
      iVar2 = isspace((uint)(byte)pcVar1[uVar4 - 2]);
      if (iVar2 == 0) {
        pcVar5 = pcVar1 + (uVar4 - 1);
        goto LAB_00105daa;
      }
      iVar2 = isspace((uint)(byte)pcVar1[uVar4 - 3]);
      if (iVar2 == 0) {
        pcVar5 = pcVar1 + (uVar4 - 2);
        goto LAB_00105daa;
      }
      iVar2 = isspace((uint)(byte)pcVar1[uVar4 - 4]);
      if (iVar2 == 0) {
        pcVar5 = pcVar1 + (uVar4 - 3);
        goto LAB_00105daa;
      }
      uVar4 = uVar4 - 4;
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  lVar3 = (long)pcVar7 - (long)pcVar1;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      pcVar5 = pcVar1;
      if ((lVar3 != 3) || (iVar2 = isspace((uint)(byte)pcVar7[-1]), pcVar5 = pcVar7, iVar2 == 0))
      goto LAB_00105daa;
      pcVar7 = pcVar6 + -1;
      pcVar6 = pcVar7;
    }
    iVar2 = isspace((uint)(byte)pcVar7[-1]);
    pcVar5 = pcVar7;
    if (iVar2 == 0) goto LAB_00105daa;
    pcVar7 = pcVar6 + -1;
  }
  iVar2 = isspace((uint)(byte)pcVar7[-1]);
  pcVar5 = pcVar7;
  if (iVar2 != 0) {
    pcVar5 = pcVar1;
  }
LAB_00105daa:
  s->_M_string_length = (long)pcVar5 - (long)pcVar1;
  *pcVar5 = '\0';
  return s;
}

Assistant:

std::string& rtrim(std::string &s) {
    s.erase(std::find_if(s.rbegin(), s.rend(), [](unsigned char c){ return !std::isspace(c); }).base(), s.end());
    return s;
}